

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

bool fs_is_removable(string_view path)

{
  string_view path_00;
  error_code eVar1;
  error_code local_48;
  string_view local_38;
  size_t local_28;
  char *local_20;
  size_t local_18;
  string_view path_local;
  
  local_20 = path._M_str;
  local_28 = path._M_len;
  local_18 = local_28;
  path_local._M_len = (size_t)local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"fs_is_removable");
  eVar1 = std::make_error_code(function_not_supported);
  local_48._M_cat = eVar1._M_cat;
  local_48._M_value = eVar1._M_value;
  path_00._M_str = local_20;
  path_00._M_len = local_28;
  fs_print_error(path_00,local_38,&local_48);
  return false;
}

Assistant:

bool
fs_is_removable(std::string_view path)
{
  // is path a removable device like a USB stick or SD card or CD-ROM, DVD, Blu-ray
  // not a fixed disk like a hard drive or SSD
#if defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getdrivetypea
  UINT t = GetDriveTypeA(fs_root(path).data());
  switch (t)
  {
    case DRIVE_REMOVABLE:
    case DRIVE_CDROM:
      return true;
    case DRIVE_FIXED:
    case DRIVE_REMOTE:
    case DRIVE_RAMDISK:
      return false;
    case DRIVE_UNKNOWN:
    case DRIVE_NO_ROOT_DIR:
      fs_print_error(path, __func__, std::make_error_code(std::errc::no_such_device));
      return false;
    default:
      return false;
  }
#else
  // Linux: find the device and check /sys/block/*/removable == 1
  // macOS: check /Volumes/*/ for a removable device
  fs_print_error(path, __func__, std::make_error_code(std::errc::function_not_supported));
  return false;
#endif

}